

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateMergeFromCodedStreamWithPacking
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  EnforceOptimizeMode EVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  Formatter format;
  Formatter local_48;
  
  local_48.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_48.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  bVar3 = FieldDescriptor::is_packed((this->super_FieldGenerator).descriptor_);
  if (bVar3) {
    Formatter::operator()<>
              (&local_48,
               "$uint32$ length;\nDO_(input->ReadVarint32(&length));\n::$proto_ns$::io::CodedInputStream::Limit limit = input->PushLimit(static_cast<int>(length));\nwhile (input->BytesUntilLimit() > 0) {\n  int value = 0;\n  DO_((::$proto_ns$::internal::WireFormatLite::ReadPrimitive<\n         int, ::$proto_ns$::internal::WireFormatLite::TYPE_ENUM>(\n       input, &value)));\n"
              );
    if (*(int *)(*(long *)((this->super_FieldGenerator).descriptor_ + 0x28) + 0x3c) == 3) {
      pcVar4 = "  add_$name$(static_cast< $type$ >(value));\n";
    }
    else {
      Formatter::operator()<>
                (&local_48,
                 "  if ($type$_IsValid(value)) {\n    _internal_add_$name$(static_cast< $type$ >(value));\n  } else {\n"
                );
      EVar1 = ((this->super_FieldGenerator).options_)->enforce_mode;
      pcVar4 = 
      "  mutable_unknown_fields()->AddVarint(\n      $number$, static_cast<$uint64$>(value));\n";
      if ((EVar1 != kSpeed) &&
         ((EVar1 == kLiteRuntime ||
          (*(int *)(*(long *)(*(long *)((this->super_FieldGenerator).descriptor_ + 0x28) + 0x88) +
                   0xa4) == 3)))) {
        pcVar4 = 
        "    unknown_fields_stream.WriteVarint32(tag);\n    unknown_fields_stream.WriteVarint32(\n        static_cast<$uint32$>(value));\n"
        ;
      }
      Formatter::operator()<>(&local_48,pcVar4);
      pcVar4 = "  }\n";
    }
    Formatter::operator()<>(&local_48,pcVar4);
    pcVar4 = "}\ninput->PopLimit(limit);\n";
  }
  else {
    lVar2 = *(long *)((this->super_FieldGenerator).descriptor_ + 0x28);
    if (*(int *)(lVar2 + 0x3c) == 3) {
      pcVar4 = 
      "DO_((::$proto_ns$::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns(\n       input,\n       $number$,\n       nullptr,\n       nullptr,\n       this->_internal_mutable_$name$())));\n"
      ;
    }
    else {
      EVar1 = ((this->super_FieldGenerator).options_)->enforce_mode;
      pcVar4 = 
      "DO_((::$proto_ns$::internal::WireFormat::ReadPackedEnumPreserveUnknowns(\n       input,\n       $number$,\n       $type$_IsValid,\n       mutable_unknown_fields(),\n       this->_internal_mutable_$name$())));\n"
      ;
      if ((EVar1 != kSpeed) &&
         ((EVar1 == kLiteRuntime || (*(int *)(*(long *)(lVar2 + 0x88) + 0xa4) == 3)))) {
        pcVar4 = 
        "DO_((::$proto_ns$::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns(\n       input,\n       $number$,\n       $type$_IsValid,\n       &unknown_fields_stream,\n       this->_internal_mutable_$name$())));\n"
        ;
      }
    }
  }
  Formatter::operator()<>(&local_48,pcVar4);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48.vars_._M_t);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::GenerateMergeFromCodedStreamWithPacking(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (!descriptor_->is_packed()) {
    // This path is rarely executed, so we use a non-inlined implementation.
    if (HasPreservingUnknownEnumSemantics(descriptor_)) {
      format(
          "DO_((::$proto_ns$::internal::"
          "WireFormatLite::ReadPackedEnumPreserveUnknowns(\n"
          "       input,\n"
          "       $number$,\n"
          "       nullptr,\n"
          "       nullptr,\n"
          "       this->_internal_mutable_$name$())));\n");
    } else if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      format(
          "DO_((::$proto_ns$::internal::WireFormat::"
          "ReadPackedEnumPreserveUnknowns(\n"
          "       input,\n"
          "       $number$,\n"
          "       $type$_IsValid,\n"
          "       mutable_unknown_fields(),\n"
          "       this->_internal_mutable_$name$())));\n");
    } else {
      format(
          "DO_((::$proto_ns$::internal::"
          "WireFormatLite::ReadPackedEnumPreserveUnknowns(\n"
          "       input,\n"
          "       $number$,\n"
          "       $type$_IsValid,\n"
          "       &unknown_fields_stream,\n"
          "       this->_internal_mutable_$name$())));\n");
    }
  } else {
    format(
        "$uint32$ length;\n"
        "DO_(input->ReadVarint32(&length));\n"
        "::$proto_ns$::io::CodedInputStream::Limit limit = "
        "input->PushLimit(static_cast<int>(length));\n"
        "while (input->BytesUntilLimit() > 0) {\n"
        "  int value = 0;\n"
        "  DO_((::$proto_ns$::internal::WireFormatLite::ReadPrimitive<\n"
        "         int, ::$proto_ns$::internal::WireFormatLite::TYPE_ENUM>(\n"
        "       input, &value)));\n");
    if (HasPreservingUnknownEnumSemantics(descriptor_)) {
      format("  add_$name$(static_cast< $type$ >(value));\n");
    } else {
      format(
          "  if ($type$_IsValid(value)) {\n"
          "    _internal_add_$name$(static_cast< $type$ >(value));\n"
          "  } else {\n");
      if (UseUnknownFieldSet(descriptor_->file(), options_)) {
        format(
            "  mutable_unknown_fields()->AddVarint(\n"
            "      $number$, static_cast<$uint64$>(value));\n");
      } else {
        format(
            "    unknown_fields_stream.WriteVarint32(tag);\n"
            "    unknown_fields_stream.WriteVarint32(\n"
            "        static_cast<$uint32$>(value));\n");
      }
      format("  }\n");
    }
    format(
        "}\n"
        "input->PopLimit(limit);\n");
  }
}